

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dice.cpp
# Opt level: O0

void __thiscall Dice::resetDiceValuesMap(Dice *this)

{
  mapped_type *pmVar1;
  key_type local_28 [6];
  Dice *local_10;
  Dice *this_local;
  
  local_28[5] = 3;
  local_10 = this;
  pmVar1 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[](&this->DiceValues,local_28 + 5);
  *pmVar1 = 0;
  local_28[4] = 1;
  pmVar1 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[](&this->DiceValues,local_28 + 4);
  *pmVar1 = 0;
  local_28[3] = 4;
  pmVar1 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[](&this->DiceValues,local_28 + 3);
  *pmVar1 = 0;
  local_28[2] = 2;
  pmVar1 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[](&this->DiceValues,local_28 + 2);
  *pmVar1 = 0;
  local_28[1] = 0;
  pmVar1 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[](&this->DiceValues,local_28 + 1);
  *pmVar1 = 0;
  local_28[0] = Ouch;
  pmVar1 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[](&this->DiceValues,local_28);
  *pmVar1 = 0;
  return;
}

Assistant:

void Dice::resetDiceValuesMap() {
    DiceValues[DiceOptions::Heal] = 0;
    DiceValues[DiceOptions::Attack] = 0;
    DiceValues[DiceOptions::Celebrity] = 0;
    DiceValues[DiceOptions::Destruction] = 0;
    DiceValues[DiceOptions::Energy] = 0;
    DiceValues[DiceOptions::Ouch] = 0;
}